

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

NESTresult * __thiscall
NEST::NESTcalc::GetYieldERdEOdxBasis
          (NESTresult *__return_storage_ptr__,NESTcalc *this,
          vector<double,_std::allocator<double>_> *dEOdxParam,string *muonInitPos,
          vector<double,_std::allocator<double>_> *vTable,
          vector<double,_std::allocator<double>_> *NRERWidthsParam)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  const_reference pvVar9;
  runtime_error *this_00;
  long lVar10;
  RandomGen *pRVar11;
  int64_t iVar12;
  size_type sVar13;
  reference pvVar14;
  VDetector *this_01;
  float fVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar20;
  double dVar21;
  double dVar22;
  double extraout_XMM0_Qa_01;
  int local_2d4;
  int index;
  double FanoScint;
  double FanoOverall;
  undefined8 local_2b8;
  double local_2b0;
  double local_2a8;
  int local_2a0;
  int iStack_29c;
  QuantaResult quanta;
  undefined1 local_250 [48];
  double local_220;
  double Ni_mean;
  YieldResult yields;
  double dStack_1e0;
  bool stopCond;
  double xi_tib;
  double norm [3];
  double distance;
  double zz;
  double yy;
  double xx;
  int local_198;
  int Nq;
  int Ne;
  int Nph;
  double Nq_mean;
  double keV;
  double vD;
  double driftTime;
  double refEnergy;
  double eStep;
  double dEOdx;
  string token;
  int ii;
  size_t loc;
  string local_120 [8];
  string delimiter;
  string position;
  double inField;
  double z_step;
  double eMin;
  double field;
  double phi;
  double r;
  double pos_z;
  double pos_y;
  double pos_x;
  double zf;
  double yf;
  double xf;
  double zi;
  double yi;
  double xi;
  double rho;
  double Wq_eV;
  Wvalue wvalue;
  vector<double,_std::allocator<double>_> *NRERWidthsParam_local;
  vector<double,_std::allocator<double>_> *vTable_local;
  string *muonInitPos_local;
  vector<double,_std::allocator<double>_> *dEOdxParam_local;
  NESTcalc *this_local;
  NESTresult *result;
  
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,8);
  dVar22 = *pvVar9;
  dVar16 = VDetector::get_molarMass(this->fdetector);
  bVar7 = VDetector::get_OldW13eV(this->fdetector);
  WorkFunction(dVar22,dVar16,bVar7);
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,8);
  dVar22 = *pvVar9;
  yi = -999.0;
  zi = -999.0;
  xf = VDetector::get_TopDrift(this->fdetector);
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,4);
  dVar16 = *pvVar9;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,5);
  dVar1 = *pvVar9;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,6);
  dVar2 = *pvVar9;
  bVar7 = ValidityTests::nearlyEqual(dVar16,0.0,1e-09);
  if ((bVar7) || (uVar8 = std::isnan(dVar16), (uVar8 & 1) != 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Energy cannot be zero or undefined");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->quanta).recombProb = 0.0;
  (__return_storage_ptr__->quanta).Variance = 0.0;
  (__return_storage_ptr__->quanta).photons = 0;
  (__return_storage_ptr__->quanta).electrons = 0;
  (__return_storage_ptr__->quanta).ions = 0;
  (__return_storage_ptr__->quanta).excitons = 0;
  (__return_storage_ptr__->yields).ElectricField = 0.0;
  (__return_storage_ptr__->yields).DeltaT_Scint = 0.0;
  (__return_storage_ptr__->yields).ExcitonRatio = 0.0;
  (__return_storage_ptr__->yields).Lindhard = 0.0;
  (__return_storage_ptr__->yields).PhotonYield = 0.0;
  (__return_storage_ptr__->yields).ElectronYield = 0.0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(&__return_storage_ptr__->photon_times);
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,0);
  dVar3 = *pvVar9;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,1);
  dVar4 = *pvVar9;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,2);
  pos_x = *pvVar9;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,3);
  bVar7 = ValidityTests::nearlyEqual(*pvVar9,-1.0,1e-09);
  if (bVar7) {
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,0);
    if ((0.0 < *pvVar9 || *pvVar9 == 0.0) || (0.0 <= dVar16)) {
      dVar17 = VDetector::get_radmax(this->fdetector);
      pRVar11 = RandomGen::rndm();
      dVar18 = RandomGen::rand_uniform(pRVar11);
      dVar18 = sqrt(dVar18);
      pRVar11 = RandomGen::rndm();
      dVar19 = RandomGen::rand_uniform(pRVar11);
      dVar20 = cos(dVar19 * 6.283185307179586);
      yi = dVar17 * dVar18 * dVar20;
      dVar19 = sin(dVar19 * 6.283185307179586);
      zi = dVar17 * dVar18 * dVar19;
    }
    else {
      yi = dVar3 - 10.0;
      xf = pos_x;
      zi = dVar4;
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)(delimiter.field_2._M_local_buf + 8),(string *)muonInitPos);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_120,",",(allocator<char> *)((long)&loc + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&loc + 7));
    token.field_2._12_4_ = 0;
    while (lVar10 = std::__cxx11::string::find
                              ((string *)(delimiter.field_2._M_local_buf + 8),(ulong)local_120),
          lVar10 != -1) {
      std::__cxx11::string::substr((ulong)&dEOdx,(ulong)((long)&delimiter.field_2 + 8));
      if (token.field_2._12_4_ == 0) {
        fVar15 = std::__cxx11::stof((string *)&dEOdx,(size_t *)0x0);
        yi = (double)fVar15;
      }
      else {
        fVar15 = std::__cxx11::stof((string *)&dEOdx,(size_t *)0x0);
        zi = (double)fVar15;
      }
      std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)((long)&delimiter.field_2 + 8),0);
      token.field_2._12_4_ = token.field_2._12_4_ + 1;
      std::__cxx11::string::~string((string *)&dEOdx);
    }
    fVar15 = std::__cxx11::stof((string *)((long)&delimiter.field_2 + 8),(size_t *)0x0);
    xf = (double)fVar15;
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string((string *)(delimiter.field_2._M_local_buf + 8));
  }
  if (xf <= 0.0) {
    xf = VDetector::get_TopDrift(this->fdetector);
  }
  if (0.0 <= dVar16) {
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,9);
    driftTime = *pvVar9;
    refEnergy = dVar16 * dVar22 * dVar1 * 100.0;
    goto LAB_0010c037;
  }
  driftTime = -dVar16;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,10);
  if (*pvVar9 <= 0.0) {
LAB_0010bf10:
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,10);
    eStep = CalcElectronLET(this,-dVar16,0x36,(bool)(-(*pvVar9 != 0.0) & 1));
  }
  else {
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,0xb);
    if ((*pvVar9 == 0.0) && (!NAN(*pvVar9))) goto LAB_0010bf10;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,10);
    dVar17 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,0xb);
    dVar18 = pow(-dVar16,*pvVar9);
    eStep = dVar17 * dVar18;
    std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,0xc);
  }
  pRVar11 = RandomGen::rndm();
  dVar17 = RandomGen::rand_zero_trunc_gauss(pRVar11,eStep,eStep);
  refEnergy = dVar22 * dVar1 * 100.0 * dVar17;
LAB_0010c037:
  Nq_mean = 0.0;
  Nq = 0;
  local_198 = 0;
  yy = yi;
  zz = zi;
  distance = xf;
  if (pos_x < 0.0) {
    pos_x = 0.0;
  }
  dVar17 = sqrt((pos_x - xf) * (pos_x - xf) +
                (dVar3 - yi) * (dVar3 - yi) + (dVar4 - zi) * (dVar4 - zi));
  yields.DeltaT_Scint._7_1_ = 0;
  while( true ) {
    bVar7 = false;
    if ((yields.DeltaT_Scint._7_1_ & 1) == 0) {
      dVar18 = VDetector::get_radmax(this->fdetector);
      this_01 = this->fdetector;
      dVar19 = VDetector::get_radmax(this_01);
      bVar7 = false;
      if (yy * yy + zz * zz < dVar18 * dVar19) {
        std::abs((int)this_01);
        bVar7 = 1e-06 < extraout_XMM0_Qa;
      }
    }
    eMin = dVar2;
    if (!bVar7) goto LAB_0010d090;
    if ((((pos_x < xf) && (distance <= pos_x)) || ((xf < pos_x && (pos_x <= distance)))) &&
       ((yy - dVar3) * (yy - dVar3) + (zz - dVar4) * (zz - dVar4) < dVar1 * 4.0 * dVar1)) break;
    if ((dVar2 == -1.0) && (!NAN(dVar2))) {
      (*this->fdetector->_vptr_VDetector[4])(yy,zz,distance);
      eMin = extraout_XMM0_Qa_00;
    }
    if (0.0 <= dVar16) {
      (*this->_vptr_NESTcalc[10])
                (driftTime,dVar22,eMin,0x3ff0000000000000,&quanta.Variance,this,
                 &default_ERYieldsParam);
      memcpy(__return_storage_ptr__,&quanta.Variance,0x30);
    }
    else {
      if (-dVar16 < Nq_mean + refEnergy) {
        refEnergy = -dVar16 - Nq_mean;
      }
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,0);
      if (0.0 < *pvVar9 || *pvVar9 == 0.0) {
        (*this->_vptr_NESTcalc[10])
                  (refEnergy,dVar22,eMin,0x3ff0000000000000,local_250,this,&default_ERYieldsParam);
        memcpy(__return_storage_ptr__,local_250,0x30);
      }
      else {
        memset(&Ni_mean,0,0x30);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,0);
        _Ne = -*pvVar9 * refEnergy;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,1);
        dVar20 = _Ne / (*pvVar9 + 1.0);
        local_220 = dVar20;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,3);
        dVar18 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,4);
        dVar21 = pow(refEnergy,*pvVar9 - 1.0);
        dVar19 = local_220;
        dStack_1e0 = dVar20 * (dVar18 / 4.0) * dVar21;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,1);
        dVar18 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,2);
        dVar20 = log(*pvVar9 + dStack_1e0);
        Ni_mean = dVar19 * ((dVar18 + 1.0) - dVar20 / dStack_1e0);
        yields.PhotonYield = _Ne - Ni_mean;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,1);
        yields.ElectronYield = *pvVar9;
        yields.ExcitonRatio = 1.0;
        yields.Lindhard = eMin;
        yields.ElectricField = -999.0;
        memcpy(__return_storage_ptr__,&Ni_mean,0x30);
      }
    }
    if ((0.0 <= dVar16) ||
       (pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,0),
       0.0 < *pvVar9 || *pvVar9 == 0.0)) {
      (*this->_vptr_NESTcalc[0xc])
                (dVar22,&FanoOverall,this,__return_storage_ptr__,&default_NRERWidthsParam);
      *(double *)&__return_storage_ptr__->quanta = FanoOverall;
      (__return_storage_ptr__->quanta).ions = (undefined4)local_2b8;
      (__return_storage_ptr__->quanta).excitons = local_2b8._4_4_;
      (__return_storage_ptr__->quanta).recombProb = local_2b0;
      (__return_storage_ptr__->quanta).Variance = local_2a8;
    }
    else {
      memset(&local_2a0,0,0x20);
      if (1.0 <= _Ne) {
        pRVar11 = RandomGen::rndm();
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,5);
        dVar18 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,5);
        iVar12 = RandomGen::binom_draw
                           (pRVar11,(long)(dVar18 * refEnergy),_Ne / (*pvVar9 * refEnergy));
        xx._4_4_ = (int)iVar12;
      }
      else {
        xx._4_4_ = 0;
      }
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,2);
      dVar18 = log(*pvVar9 + dStack_1e0);
      quanta._8_8_ = 1.0 - dVar18 / dStack_1e0;
      if (((__return_storage_ptr__->yields).PhotonYield <= 1.0 &&
           (__return_storage_ptr__->yields).PhotonYield != 1.0) || (xx._4_4_ < 1)) {
        local_2a0 = 0;
      }
      else {
        pRVar11 = RandomGen::rndm();
        iVar12 = RandomGen::binom_draw
                           (pRVar11,(long)xx._4_4_,
                            (__return_storage_ptr__->yields).PhotonYield / (double)xx._4_4_);
        local_2a0 = (int)iVar12;
      }
      iStack_29c = xx._4_4_ - local_2a0;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,1);
      dVar18 = ceil((double)xx._4_4_ / (*pvVar9 + 1.0) - 0.5);
      quanta.photons = (int)dVar18;
      quanta.electrons = xx._4_4_ - quanta.photons;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,2);
      dVar18 = log(*pvVar9 + dStack_1e0);
      quanta._8_8_ = 1.0 - dVar18 / dStack_1e0;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,6);
      quanta.recombProb = *pvVar9 * (__return_storage_ptr__->yields).PhotonYield;
      (__return_storage_ptr__->quanta).photons = local_2a0;
      (__return_storage_ptr__->quanta).electrons = iStack_29c;
      (__return_storage_ptr__->quanta).ions = quanta.photons;
      (__return_storage_ptr__->quanta).excitons = quanta.electrons;
      (__return_storage_ptr__->quanta).recombProb = (double)quanta._8_8_;
      (__return_storage_ptr__->quanta).Variance = quanta.recombProb;
      local_198 = (__return_storage_ptr__->quanta).electrons + local_198;
    }
    if (dVar16 <= 0.0) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,0);
      if (0.0 <= *pvVar9) {
        iVar6 = (__return_storage_ptr__->quanta).photons;
        iVar5 = (__return_storage_ptr__->quanta).electrons;
        pRVar11 = RandomGen::rndm();
        dVar19 = (double)(iVar6 + iVar5);
        dVar18 = sqrt(dVar19 * 1.0);
        dVar18 = RandomGen::rand_gauss(pRVar11,dVar19,dVar18,false);
        dVar18 = floor(dVar18 + 0.5);
        pRVar11 = RandomGen::rndm();
        dVar20 = (double)(__return_storage_ptr__->quanta).photons;
        dVar19 = sqrt(dVar20 * 200.0);
        dVar19 = RandomGen::rand_gauss(pRVar11,dVar20,dVar19,false);
        dVar19 = floor(dVar19 + 0.5);
        (__return_storage_ptr__->quanta).photons = (int)dVar19;
        (__return_storage_ptr__->quanta).electrons =
             (int)dVar18 - (__return_storage_ptr__->quanta).photons;
      }
      Nq = (__return_storage_ptr__->quanta).photons + Nq;
    }
    else {
      Nq = (int)((double)(__return_storage_ptr__->quanta).photons * (refEnergy / driftTime) +
                (double)Nq);
    }
    dVar18 = floor(distance / dVar1 + 0.5);
    local_2d4 = (int)dVar18;
    sVar13 = std::vector<double,_std::allocator<double>_>::size(vTable);
    if (sVar13 <= (ulong)(long)local_2d4) {
      sVar13 = std::vector<double,_std::allocator<double>_>::size(vTable);
      local_2d4 = (int)sVar13 + -1;
    }
    sVar13 = std::vector<double,_std::allocator<double>_>::size(vTable);
    if (sVar13 == 0) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,7);
      keV = *pvVar9;
    }
    else {
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](vTable,(long)local_2d4);
      keV = *pvVar14;
    }
    dVar18 = VDetector::get_TopDrift(this->fdetector);
    dVar18 = (dVar18 - distance) / keV;
    dVar19 = VDetector::get_cathode(this->fdetector);
    if ((dVar19 <= distance) &&
       (pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,0),
       0.0 <= *pvVar9)) {
      if (dVar16 <= 0.0) {
        iVar6 = (__return_storage_ptr__->quanta).electrons;
        dVar19 = VDetector::get_eLife_us(this->fdetector);
        dVar18 = exp(-dVar18 / dVar19);
        dVar18 = (double)iVar6 * dVar18 + (double)local_198;
      }
      else {
        iVar6 = (__return_storage_ptr__->quanta).electrons;
        dVar19 = VDetector::get_eLife_us(this->fdetector);
        dVar18 = exp(-dVar18 / dVar19);
        dVar18 = (double)iVar6 * dVar18 * (refEnergy / driftTime) + (double)local_198;
      }
      local_198 = (int)dVar18;
    }
    Nq_mean = refEnergy + Nq_mean;
    yy = ((dVar3 - yi) / dVar17) * dVar1 + yy;
    zz = ((dVar4 - zi) / dVar17) * dVar1 + zz;
    distance = ((pos_x - xf) / dVar17) * dVar1 + distance;
    if (dVar16 < 0.0) {
      driftTime = driftTime - refEnergy;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,10);
      if (*pvVar9 <= 0.0) {
LAB_0010cffb:
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,10);
        eStep = CalcElectronLET(this,driftTime,0x36,(bool)(-(*pvVar9 != 0.0) & 1));
      }
      else {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,0xb);
        if ((*pvVar9 == 0.0) && (!NAN(*pvVar9))) goto LAB_0010cffb;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,10);
        dVar18 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,0xb);
        dVar19 = pow(driftTime,*pvVar9);
        eStep = dVar18 * dVar19;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,0xc);
        if (0.0 < *pvVar9) {
          pRVar11 = RandomGen::rndm();
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](dEOdxParam,0xc);
          eStep = RandomGen::rand_gauss(pRVar11,eStep,*pvVar9 * eStep,true);
        }
      }
      refEnergy = eStep * dVar22 * dVar1 * 100.0;
    }
  }
  yields.DeltaT_Scint._7_1_ = 1;
LAB_0010d090:
  if (Nq < 0) {
    Nq = 0;
  }
  if (local_198 < 0) {
    local_198 = 0;
  }
  (__return_storage_ptr__->quanta).photons = Nq;
  (__return_storage_ptr__->quanta).electrons = local_198;
  dVar22 = (xf + distance) * 0.5;
  if ((dVar2 == -1.0) && (!NAN(dVar2))) {
    (*this->fdetector->_vptr_VDetector[4])((yi + yy) * 0.5,(zi + zz) * 0.5,dVar22);
    eMin = extraout_XMM0_Qa_01;
  }
  (__return_storage_ptr__->yields).DeltaT_Scint = dVar22;
  (__return_storage_ptr__->yields).ElectricField = eMin;
  return __return_storage_ptr__;
}

Assistant:

NESTresult NESTcalc::GetYieldERdEOdxBasis(
    const std::vector<double> &dEOdxParam, string muonInitPos,
    vector<double> vTable, const std::vector<double> &NRERWidthsParam) {
  Wvalue wvalue = WorkFunction(dEOdxParam[8], fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double rho = dEOdxParam[8];
  double xi = -999., yi = -999., zi = fdetector->get_TopDrift();
  double xf, yf, zf, pos_x, pos_y, pos_z, r, phi, field,
      eMin = dEOdxParam[4], z_step = dEOdxParam[5], inField = dEOdxParam[6];
  if (ValidityTests::nearlyEqual(eMin, 0.) || std::isnan(eMin))
    throw std::runtime_error("Energy cannot be zero or undefined");
  NESTresult result{};
  xf = dEOdxParam[0];
  yf = dEOdxParam[1];
  zf = dEOdxParam[2];
  if (ValidityTests::nearlyEqual(dEOdxParam[3], -1.)) {
    if (NRERWidthsParam[0] < 0. && eMin < 0.) {
      xi = xf - 10.;
      yi = yf;
      zi = zf;
    } else {
      r = fdetector->get_radmax() * sqrt(RandomGen::rndm()->rand_uniform());
      phi = 2. * M_PI * RandomGen::rndm()->rand_uniform();
      xi = r * cos(phi);
      yi = r * sin(phi);
    }
  } else {
    string position = muonInitPos;
    string delimiter = ",";
    size_t loc = 0;
    int ii = 0;
    while ((loc = position.find(delimiter)) != string::npos) {
      string token = position.substr(0, loc);
      if (ii == 0)
        xi = stof(token);
      else
        yi = stof(token);
      position.erase(0, loc + delimiter.length());
      ++ii;
    }
    zi = stof(position);
  }
  if (zi <= 0.) zi = fdetector->get_TopDrift();
  double dEOdx, eStep, refEnergy;
  if (eMin < 0.) {
    refEnergy = -eMin;
    if (dEOdxParam[10] > 0. && dEOdxParam[11] != 0.) {
      dEOdx = dEOdxParam[10] * pow(-eMin, dEOdxParam[11]);
      if (dEOdxParam[12] > 0.)
	; //do nothing yet. Old attempts: Gaussian, Expo, Poisson
    } else
      dEOdx = CalcElectronLET(-eMin, ATOM_NUM, dEOdxParam[10]);
    eStep = rho * z_step * 1e2 * RandomGen::rndm()->rand_zero_trunc_gauss(dEOdx,dEOdx);
  } else {
    refEnergy = dEOdxParam[9];
    eStep = eMin * rho * z_step * 1e2;
  }
  double driftTime, vD, keV = 0., Nq_mean;
  int Nph = 0, Ne = 0, Nq = 0;
  double xx = xi, yy = yi, zz = zi;
  if (zf < 0.) zf = 0.;
  double distance = sqrt((xf - xi) * (xf - xi) + (yf - yi) * (yf - yi) +
                         (zf - zi) * (zf - zi));
  double norm[3];
  double xi_tib;
  norm[0] = (xf - xi) / distance;
  norm[1] = (yf - yi) / distance;
  norm[2] = (zf - zi) / distance;
  bool stopCond = false;
  while (!stopCond &&
         (xx * xx + yy * yy) <
             fdetector->get_radmax() * fdetector->get_radmax() &&
         std::abs(refEnergy) > PHE_MIN) {
    if (((zf < zi && zz <= zf) || (zf > zi && zz >= zf)) &&
        ((xx - xf) * (xx - xf) + (yy - yf) * (yy - yf)) <
            4. * z_step * z_step) {
      stopCond = true;
      break;
    }
    // stop making S1 and S2 if particle exits Xe volume, OR runs out of
    // energy (in case of beta)
    if (inField == -1.)
      field = fdetector->FitEF(xx, yy, zz);
    else
      field = inField;
    if (eMin < 0.) {
      if ((keV + eStep) > -eMin) eStep = -eMin - keV;
      if (NRERWidthsParam[0] < 0.) {
        YieldResult yields{};
        Nq_mean = -NRERWidthsParam[0] * eStep;
        double Ni_mean = Nq_mean / (1. + NRERWidthsParam[1]);
        xi_tib = Ni_mean * (NRERWidthsParam[3] / 4.) *
                 pow(eStep, NRERWidthsParam[4] - 1.);
        yields.PhotonYield =
            Ni_mean * (1. + NRERWidthsParam[1] -
                       log(NRERWidthsParam[2] + xi_tib) / xi_tib);
        yields.ElectronYield = Nq_mean - yields.PhotonYield;
        yields.ExcitonRatio = NRERWidthsParam[1];
        yields.Lindhard = 1.;
        yields.ElectricField = field;
        yields.DeltaT_Scint = -999;
        result.yields = yields;
      } else
        result.yields = GetYieldBetaGR(eStep, rho, field);
    } else {
      result.yields = GetYieldBetaGR(refEnergy, rho, field);
    }
    if (eMin < 0. && NRERWidthsParam[0] < 0.) {
      QuantaResult quanta{};
      if (Nq_mean < 1.)
        Nq = 0;
      else //int(ceil(RandomGen::rndm()->rand_gauss(Nq_mean,sqrt(NRERWidthsParam[5]*Nq_mean),true)-0.5))
        Nq = RandomGen::rndm()->binom_draw(NRERWidthsParam[5]*eStep,Nq_mean/(NRERWidthsParam[5]*eStep));
      quanta.recombProb = 1. - log(NRERWidthsParam[2] + xi_tib) / xi_tib;
      if (result.yields.PhotonYield < 1. || Nq <= 0)
        quanta.photons = 0;
      else //int(ceil(RandomGen::rndm()->rand_gauss(result.yields.PhotonYield,sqrt(NRERWidthsParam[6]*result.yields.PhotonYield),true)-0.5))
        quanta.photons = RandomGen::rndm()->binom_draw(Nq,result.yields.PhotonYield/double(Nq));
      quanta.electrons = Nq - quanta.photons;
      quanta.ions = int(ceil(double(Nq) / (1. + NRERWidthsParam[1]) - 0.5));
      quanta.excitons = Nq - quanta.ions;
      quanta.recombProb = 1. - log(NRERWidthsParam[2] + xi_tib) / xi_tib;
      quanta.Variance = NRERWidthsParam[6] * result.yields.PhotonYield;
      result.quanta = quanta;
      Ne += result.quanta.electrons;
    } else
      result.quanta =
          GetQuanta(result.yields, rho, default_NRERWidthsParam, -999.);
    if (eMin > 0.)
      Nph += result.quanta.photons * (eStep / refEnergy);
    else {
      if (NRERWidthsParam[0] >= 0.) {
        Nq = result.quanta.photons + result.quanta.electrons;
        double FanoOverall =
            1.;  // use 6 for ~0.7% energy resolution at 2.6 MeV and 190 V/cm
        double FanoScint =
            200.;  // standin for recombination fluctuations in this approach
        Nq = int(floor(
            RandomGen::rndm()->rand_gauss(Nq, sqrt(FanoOverall * Nq), false) +
            0.5));
        result.quanta.photons =
            int(floor(RandomGen::rndm()->rand_gauss(
                          result.quanta.photons,
                          sqrt(FanoScint * result.quanta.photons), false) +
                      0.5));
        result.quanta.electrons = Nq - result.quanta.photons;
      }
      Nph += result.quanta.photons;
    }
    int index = int(floor(zz / z_step + 0.5));
    if (index >= vTable.size()) index = vTable.size() - 1;
    if (vTable.size() == 0)
      vD = dEOdxParam[7];
    else
      vD = vTable[index];
    driftTime = (fdetector->get_TopDrift() - zz) / vD;
    if (zz >= fdetector->get_cathode() && NRERWidthsParam[0] >= 0.) {
      if (eMin > 0.)
        Ne += result.quanta.electrons *
              exp(-driftTime / fdetector->get_eLife_us()) * (eStep / refEnergy);
      else
        Ne += result.quanta.electrons *
              exp(-driftTime / fdetector->get_eLife_us());
    }
    keV += eStep;
    xx += norm[0] * z_step;
    yy += norm[1] * z_step;
    zz += norm[2] * z_step;
    if (eMin < 0.) {
      refEnergy -= eStep;
      if (dEOdxParam[10] > 0. && dEOdxParam[11] != 0.) {
        dEOdx = dEOdxParam[10] * pow(refEnergy, dEOdxParam[11]);
        if (dEOdxParam[12] > 0.)
          dEOdx = RandomGen::rndm()->rand_gauss(dEOdx, dEOdxParam[12] * dEOdx,
                                                true);
      } else
        dEOdx = CalcElectronLET(refEnergy, ATOM_NUM, dEOdxParam[10]);
      eStep = dEOdx * rho * z_step * 1e2;
    }
    // cerr << keV << "\t\t" << xx << "\t" << yy << "\t" << zz << "\t" << Nph <<
    // "\t" << Ne << endl;
  }
  if (Nph < 0) Nph = 0;
  if (Ne < 0) Ne = 0;
  result.quanta.photons = Nph;
  result.quanta.electrons = Ne;
  pos_x =
      0.5 * (xi + xx);  // approximate things not already done right in loop as
  // middle of detector since muon traverses whole length
  pos_y = 0.5 * (yi + yy);
  pos_z = 0.5 * (zi + zz);
  if (inField == -1.)
    field = fdetector->FitEF(pos_x, pos_y, pos_z);
  else
    field = inField;
  result.yields.DeltaT_Scint = pos_z;
  result.yields.ElectricField = field;
  return result;
}